

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version.cc
# Opt level: O3

void version(int argc,char **argv)

{
  long lVar1;
  ostream *poVar2;
  long *plVar3;
  string argv0;
  long *local_48;
  long local_40;
  long local_38 [2];
  long *local_28 [2];
  long local_18 [2];
  
  std::__cxx11::string::string((string *)&local_48,*argv,(allocator *)local_28);
  lVar1 = std::__cxx11::string::rfind((char)&local_48,0x2f);
  if (lVar1 != -1) {
    std::__cxx11::string::substr((ulong)local_28,(ulong)&local_48);
    std::__cxx11::string::operator=((string *)&local_48,(string *)local_28);
    if (local_28[0] != local_18) {
      operator_delete(local_28[0],local_18[0] + 1);
    }
  }
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_48,local_40);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," -- ",4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"1a02b19",7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," (",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Sat, 9 Apr 2022 11:08:45 -0700",0x1e);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  plVar3 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Part of goestools (https://github.com/pietern/goestools)",0x38);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
  std::ostream::put(-0x38);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Written by Pieter Noordhuis and contributors",0x2c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
  std::ostream::put(-0x38);
  std::ostream::flush();
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  return;
}

Assistant:

void version(int argc, char** argv) {
  std::string argv0(argv[0]);
  auto pos = argv0.rfind('/');
  if (pos != std::string::npos) {
    argv0 = argv0.substr(pos + 1);
  }

  std::cout
    << argv0
    << " -- " << GIT_COMMIT_HASH
    << " (" << GIT_COMMIT_DATE << ")"
    << std::endl
    << std::endl;
  std::cout
    << "Part of goestools (https://github.com/pietern/goestools)"
    << std::endl;
  std::cout
    << "Written by Pieter Noordhuis and contributors"
    << std::endl;
}